

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

uint64_t GetCombinedEntropy(VP8LHistogram *h1,VP8LHistogram *h2,HistogramIndex index)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  VP8LStreaks *stats_00;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int is_trivial;
  int is_h2_used;
  int is_h1_used;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  int length;
  uint32_t *Y;
  uint32_t *X;
  int *in_stack_ffffffffffffff78;
  uint32_t **in_stack_ffffffffffffff80;
  uint3 in_stack_ffffffffffffff88;
  uint uVar4;
  HistogramIndex index_00;
  VP8LBitEntropy local_68;
  VP8LStreaks local_4c;
  int local_34;
  uint32_t *local_30;
  uint32_t *local_28;
  uint64_t local_8;
  
  bVar1 = *(byte *)(in_RDI + 0xce8 + (ulong)in_EDX);
  uVar2 = (uint)bVar1;
  uVar3 = (uint)*(byte *)(in_RSI + 0xce8 + (ulong)in_EDX);
  uVar4 = (uint)in_stack_ffffffffffffff88;
  if (*(short *)(in_RDI + 0xcac + (ulong)in_EDX * 2) != -1) {
    uVar4 = CONCAT13(*(short *)(in_RDI + 0xcac + (ulong)in_EDX * 2) ==
                     *(short *)(in_RSI + 0xcac + (ulong)in_EDX * 2),in_stack_ffffffffffffff88);
  }
  index_00 = uVar4 >> 0x18;
  if (((index_00 == LITERAL) && (uVar2 != 0)) && (uVar3 != 0)) {
    GetPopulationInfo((VP8LHistogram *)(ulong)CONCAT14(bVar1,uVar3),LITERAL,
                      in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    GetPopulationInfo((VP8LHistogram *)CONCAT44(uVar2,uVar3),index_00,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78);
    (*VP8LGetCombinedEntropyUnrefined)(local_28,local_30,local_34,&local_68,&local_4c);
    stats_00 = (VP8LStreaks *)BitsEntropyRefine((VP8LBitEntropy *)CONCAT44(index_00,uVar4));
    local_8 = FinalHuffmanCost(stats_00);
    local_8 = (long)stats_00->counts + local_8;
  }
  else if (uVar2 == 0) {
    local_8 = *(uint64_t *)(in_RSI + 0xcc0 + (ulong)in_EDX * 8);
  }
  else {
    local_8 = *(uint64_t *)(in_RDI + 0xcc0 + (ulong)in_EDX * 8);
  }
  return local_8;
}

Assistant:

static WEBP_INLINE uint64_t GetCombinedEntropy(const VP8LHistogram* const h1,
                                               const VP8LHistogram* const h2,
                                               HistogramIndex index) {
  const uint32_t* X;
  const uint32_t* Y;
  int length;
  VP8LStreaks stats;
  VP8LBitEntropy bit_entropy;
  const int is_h1_used = h1->is_used[index];
  const int is_h2_used = h2->is_used[index];
  const int is_trivial = h1->trivial_symbol[index] != VP8L_NON_TRIVIAL_SYM &&
                         h1->trivial_symbol[index] == h2->trivial_symbol[index];

  if (is_trivial || !is_h1_used || !is_h2_used) {
    if (is_h1_used) return h1->costs[index];
    return h2->costs[index];
  }
  assert(is_h1_used && is_h2_used);

  GetPopulationInfo(h1, index, &X, &length);
  GetPopulationInfo(h2, index, &Y, &length);
  VP8LGetCombinedEntropyUnrefined(X, Y, length, &bit_entropy, &stats);
  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}